

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O0

void __thiscall
Database::iterator::iterator(iterator *this,files_iterator *fbegin,files_iterator *fend)

{
  bool bVar1;
  pointer pDVar2;
  bool local_61;
  undefined1 local_50 [16];
  pointer local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *lines_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  pointer local_28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *lines;
  files_iterator *fend_local;
  files_iterator *fbegin_local;
  iterator *this_local;
  
  lines = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)fend;
  fend_local = fbegin;
  fbegin_local = &this->files_it;
  std::
  reverse_iterator<__gnu_cxx::__normal_iterator<Datafile_*,_std::vector<Datafile,_std::allocator<Datafile>_>_>_>
  ::reverse_iterator(&this->files_it,fbegin);
  std::
  reverse_iterator<__gnu_cxx::__normal_iterator<Datafile_*,_std::vector<Datafile,_std::allocator<Datafile>_>_>_>
  ::reverse_iterator(&this->files_end,fend);
  std::
  reverse_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::reverse_iterator(&this->lines_it);
  std::
  reverse_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::reverse_iterator(&this->lines_end);
  bVar1 = std::operator!=(&this->files_end,&this->files_it);
  if (bVar1) {
    pDVar2 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<Datafile_*,_std::vector<Datafile,_std::allocator<Datafile>_>_>_>
             ::operator->(&this->files_it);
    local_28 = (pointer)Datafile::allLines_abi_cxx11_(pDVar2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::rbegin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&stack0xffffffffffffffd0);
    (this->lines_it).current._M_current = local_30;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::rend((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&lines_1);
    (this->lines_end).current._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)lines_1;
    while( true ) {
      bVar1 = std::operator==(&this->lines_it,&this->lines_end);
      local_61 = false;
      if (bVar1) {
        local_61 = std::operator!=(&this->files_it,&this->files_end);
      }
      if (local_61 == false) break;
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<Datafile_*,_std::vector<Datafile,_std::allocator<Datafile>_>_>_>
      ::operator++(&this->files_it);
      bVar1 = std::operator!=(&this->files_it,&this->files_end);
      if (bVar1) {
        pDVar2 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<Datafile_*,_std::vector<Datafile,_std::allocator<Datafile>_>_>_>
                 ::operator->(&this->files_it);
        local_40 = (pointer)Datafile::allLines_abi_cxx11_(pDVar2);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::rbegin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_50 + 8));
        (this->lines_it).current._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50._8_8_;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::rend((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_50);
        (this->lines_end).current._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50._0_8_;
      }
    }
  }
  return;
}

Assistant:

Database::iterator::iterator (files_iterator fbegin, files_iterator fend) :
  files_it (fbegin),
  files_end (fend)
{
  if (files_end != files_it)
  {
    auto& lines = files_it->allLines ();
    lines_it = lines.rbegin ();
    lines_end = lines.rend ();
    while ((lines_it == lines_end) && (files_it != files_end))
    {
      ++files_it;
      if (files_it != files_end)
      {
        auto& lines = files_it->allLines ();
        lines_it = lines.rbegin ();
        lines_end = lines.rend ();
      }
    }
  }
}